

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
ExportDirWrapper::containsAddrType(ExportDirWrapper *this,size_t fieldId,size_t subField)

{
  size_t subField_local;
  size_t fieldId_local;
  ExportDirWrapper *this_local;
  
  if ((fieldId == 4) || (fieldId - 8 < 3)) {
    this_local._4_4_ = RVA;
  }
  else {
    this_local._4_4_ = NOT_ADDR;
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type ExportDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case NAME_RVA:
        case FUNCTIONS_RVA:
        case FUNC_NAMES_RVA:
        case NAMES_ORDINALS_RVA:
            return Executable::RVA;
    }
    return Executable::NOT_ADDR;
}